

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall SslTcpServer::SslTcpServer(SslTcpServer *this)

{
  unique_ptr<SslTcpServerImpl,_std::default_delete<SslTcpServerImpl>_> local_18;
  SslTcpServer *local_10;
  SslTcpServer *this_local;
  
  local_10 = this;
  TcpServer::TcpServer(&this->super_TcpServer,false);
  (this->super_TcpServer).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__SslTcpServer_001b7ce8;
  std::make_unique<SslTcpServerImpl,SslTcpServer*>((SslTcpServer **)&local_18);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_TcpServer).super_BaseSocket.Impl_,&local_18);
  std::unique_ptr<SslTcpServerImpl,_std::default_delete<SslTcpServerImpl>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

SslTcpServer::SslTcpServer() : TcpServer(false)
{
    Impl_ = make_unique<SslTcpServerImpl>(this);
}